

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.y
# Opt level: O2

Element * __thiscall DocumentStorage::getTag(DocumentStorage *this,string *nm)

{
  const_iterator cVar1;
  Element *pEVar2;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Element_*>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Element_*>_>_>
                  *)&this->tagmap,nm);
  if (cVar1._M_node == (_Base_ptr)&this->field_0x20) {
    pEVar2 = (Element *)0x0;
  }
  else {
    pEVar2 = *(Element **)(cVar1._M_node + 2);
  }
  return pEVar2;
}

Assistant:

const Element *DocumentStorage::getTag(const string &nm) const

{ // Retrieve a registered tag by name
  map<string,const Element *>::const_iterator iter;

  iter = tagmap.find(nm);
  if (iter != tagmap.end())
    return (*iter).second;
  return (const Element *)0;
}